

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall asl::Array<asl::Socket>::free(Array<asl::Socket> *this,void *__ptr)

{
  Socket *p;
  Data *pDVar1;
  Array<asl::Socket> *this_local;
  
  p = this->_a;
  pDVar1 = d(this);
  asl_destroy<asl::Socket>(p,pDVar1->n);
  ::free(this->_a + -2);
  this->_a = (Socket *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}